

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  string *titleIn;
  InitError *e;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  App a;
  char **argv_local;
  int argc_local;
  
  a.pixels = (Uint32 *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"SDL-App",&local_91);
  titleIn = (string *)local_90;
  app::App::App((App *)local_70,titleIn);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  app::App::init((App *)local_70,(EVP_PKEY_CTX *)titleIn);
  app::App::mainLoop((App *)local_70);
  std::operator<<((ostream *)&std::cout,"Finished");
  app::App::~App((App *)local_70);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
     app::App a;

     try {
          a.init();
     }

     catch (const error::InitError& e) {
          std::cerr << "Error while initializing App: "
                    << e.what() << std::endl;
          return 1;
     }

     a.mainLoop();

     std::cout << "Finished";

     return 0;
}